

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::GradX
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,
          TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *gradx)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  TPZFMatrix<Fad<double>_> *in_stack_00003e78;
  TPZVec<Fad<double>_> *in_stack_00003e80;
  TPZFMatrix<double> *in_stack_00003e88;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_00003e90;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  TPZFNMatrix<54,_double>::TPZFNMatrix
            ((TPZFNMatrix<54,_double> *)in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  CornerCoordinates(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::GradX<Fad<double>>
            (in_stack_00003e90,in_stack_00003e88,in_stack_00003e80,in_stack_00003e78);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x16fb731);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<Fad<REAL> > &par, TPZFMatrix<Fad<REAL> > &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}